

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::JoinRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,JoinRelation *this,idx_t depth)

{
  pointer pPVar1;
  Relation *pRVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_38,(Relation *)depth,depth);
  EnumUtil::ToString<duckdb::JoinRefType>(&local_78,this->join_ref_type);
  ::std::operator+(&local_58,"Join ",&local_78);
  ::std::operator+(&bStack_d8,&local_58," ");
  EnumUtil::ToString<duckdb::JoinType>(&local_98,this->join_type);
  ::std::operator+(&local_b8,&bStack_d8,&local_98);
  ::std::__cxx11::string::append((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&bStack_d8);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  if ((this->condition).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->condition);
    (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[7])(&bStack_d8,pPVar1);
    ::std::operator+(&local_b8," ",&bStack_d8);
    ::std::__cxx11::string::append((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_b8);
    ::std::__cxx11::string::~string((string *)&bStack_d8);
  }
  ::std::operator+(&local_58,&local_38,anon_var_dwarf_4b71d2e + 8);
  pRVar2 = shared_ptr<duckdb::Relation,_true>::operator->(&this->left);
  (*pRVar2->_vptr_Relation[6])(&local_78,pRVar2,depth + 1);
  ::std::operator+(&bStack_d8,&local_58,&local_78);
  ::std::operator+(&local_b8,&bStack_d8,anon_var_dwarf_4b71d2e + 8);
  pRVar2 = shared_ptr<duckdb::Relation,_true>::operator->(&this->right);
  (*pRVar2->_vptr_Relation[6])(&local_98,pRVar2,depth + 1);
  ::std::operator+(__return_storage_ptr__,&local_b8,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&bStack_d8);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string JoinRelation::ToString(idx_t depth) {
	string str = RenderWhitespace(depth);
	str += "Join " + EnumUtil::ToString(join_ref_type) + " " + EnumUtil::ToString(join_type);
	if (condition) {
		str += " " + condition->GetName();
	}

	return str + "\n" + left->ToString(depth + 1) + "\n" + right->ToString(depth + 1);
}